

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void snapshot_concurrent_compaction_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  ushort uVar4;
  uint uVar5;
  char *__format;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  cb_snapshot_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.compaction_cb_ctx = &cb_args;
  cb_args.niterations = 0;
  cb_args._20_4_ = 0;
  cb_args.handle = (fdb_kvs_handle *)0x0;
  cb_args.ndocs = 0;
  cb_args.nupdates = 0;
  fconfig.wal_threshold = 0x80;
  fconfig.flags = 1;
  fconfig.compaction_cb = cb_snapshot;
  fconfig.compaction_cb_mask = 0x11;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  fdb_kvs_open(dbfile,&db,"db",&kvs_config);
  cb_args.handle = db;
  uVar4 = 1;
  uVar5 = 0;
  while( true ) {
    if (uVar5 == 100) {
      cb_args.ndocs = 100;
      cb_args.nupdates = 2;
      cb_args.niterations = 10;
      _snapshot_check(db,100,2);
      fVar1 = fdb_compact(dbfile,"./mvcc_test2");
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_close(dbfile);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (snapshot_concurrent_compaction_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"snapshot with concurrent compaction test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0xff1);
      snapshot_concurrent_compaction_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0xff1,"void snapshot_concurrent_compaction_test()");
    }
    sprintf(keybuf,"key%04d",(ulong)uVar5);
    sprintf(bodybuf,"body%04d_update%d",(ulong)uVar5,(ulong)(0x31 < uVar5));
    handle = db;
    sVar2 = strlen(keybuf);
    sVar3 = strlen(bodybuf);
    fVar1 = fdb_set_kv(handle,keybuf,sVar2 + 1,bodybuf,sVar3 + 1);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    if ((char)((char)(uVar4 / 0x32) * '2' + -1) == (char)uVar5) {
      fVar1 = fdb_commit(dbfile,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xfe7);
        snapshot_concurrent_compaction_test()::__test_pass = 1;
        __assert_fail("s == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0xfe7,"void snapshot_concurrent_compaction_test()");
      }
    }
    uVar4 = (ushort)(byte)((char)uVar4 + 1);
    uVar5 = uVar5 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0xfe4);
  snapshot_concurrent_compaction_test()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0xfe4,"void snapshot_concurrent_compaction_test()");
}

Assistant:

void snapshot_concurrent_compaction_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, idx, r;
    int n = 100;
    int commit_term = n/2;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_snapshot_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_snapshot_args));
    fconfig.wal_threshold = 128;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = cb_snapshot;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_END;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    cb_args.handle = db;

    // write docs & commit for each n/2 doc updates
    for (i=0;i<n;++i){
        idx = i;
        j = i/commit_term;
        sprintf(keybuf, "key%04d", idx);
        sprintf(bodybuf, "body%04d_update%d", idx, j);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1,
                           bodybuf, strlen(bodybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if ((i+1)%commit_term == 0) {
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }
    cb_args.ndocs = n;
    cb_args.nupdates = 2;
    cb_args.niterations = 10;

    _snapshot_check(db, cb_args.ndocs, cb_args.nupdates);

    s = fdb_compact(dbfile, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("snapshot with concurrent compaction test");
}